

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O3

Atlas * xatlas::Create(void)

{
  Atlas *pAVar1;
  TaskScheduler *this;
  
  pAVar1 = (Atlas *)(*(code *)internal::s_realloc)(0);
  if (pAVar1 != (Atlas *)0x0) {
    memset(pAVar1 + 1,0,0xe0);
    *(undefined4 *)&pAVar1[1].meshes = 0xffffffff;
    pAVar1[1].width = 8;
    pAVar1[1].atlasCount = 0;
    *(undefined4 *)&pAVar1[2].image = 0x48;
    *(undefined4 *)&pAVar1[2].meshes = 0;
    pAVar1[2].width = 0x18;
    pAVar1[2].atlasCount = 0;
    pAVar1[3].width = 0;
    pAVar1[3].height = 0;
    pAVar1[3].image = (uint32_t *)0x0;
    pAVar1[3].meshes = (Mesh *)0x0;
    pAVar1[3].atlasCount = 8;
    pAVar1[3].meshCount = 0;
    *(undefined4 *)&pAVar1[4].meshes = 8;
    *(undefined4 *)&pAVar1[4].utilization = 0;
    pAVar1[4].atlasCount = 8;
    pAVar1[4].meshCount = 0;
    *(undefined4 *)&pAVar1[5].meshes = 8;
    *(undefined4 *)&pAVar1[5].utilization = 0;
    pAVar1->image = (uint32_t *)0x0;
    pAVar1->meshes = (Mesh *)0x0;
    pAVar1->utilization = (float *)0x0;
    pAVar1->width = 0;
    pAVar1->height = 0;
    pAVar1->atlasCount = 0;
    pAVar1->chartCount = 0;
    pAVar1->meshCount = 0;
    pAVar1->texelsPerUnit = 0.0;
    this = (TaskScheduler *)(*(code *)internal::s_realloc)(0,0x28);
    if (this != (TaskScheduler *)0x0) {
      internal::TaskScheduler::TaskScheduler(this);
      pAVar1[3].utilization = (float *)this;
      return pAVar1;
    }
  }
  __assert_fail("size <= 0 || (size > 0 && mem)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                ,0x1ae,"void *xatlas::internal::Realloc(void *, size_t, int, const char *, int)");
}

Assistant:

Atlas *Create()
{
	Context *ctx = XA_NEW(internal::MemTag::Default, Context);
	memset(&ctx->atlas, 0, sizeof(Atlas));
	ctx->taskScheduler = XA_NEW(internal::MemTag::Default, internal::TaskScheduler);
	return &ctx->atlas;
}